

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_script.cpp
# Opt level: O0

void __thiscall cfd::core::Script::SetStackData(Script *this,ByteData *bytedata)

{
  allocator<cfd::core::ScriptType> *this_00;
  pointer *this_01;
  initializer_list<cfd::core::ScriptType> __l;
  initializer_list<cfd::core::ScriptType> __l_00;
  initializer_list<cfd::core::ScriptType> __l_01;
  bool bVar1;
  int iVar2;
  uint uVar3;
  size_type sVar4;
  byte *pbVar5;
  ushort *puVar6;
  uint *puVar7;
  pointer ppVar8;
  size_type sVar9;
  reference this_02;
  reference pvVar10;
  size_t sVar11;
  InvalidScriptException *pIVar12;
  size_type sVar13;
  int64_t value;
  allocator local_551;
  string local_550;
  CfdSourceLocation local_530;
  undefined1 local_518 [8];
  ScriptElement script_element_3;
  ByteData byte_array;
  undefined1 local_488 [8];
  ScriptElement script_element_2;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_410;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_408;
  uchar *local_400;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_3f8;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_3f0;
  undefined1 local_3e2;
  allocator local_3e1;
  string local_3e0;
  CfdSourceLocation local_3c0;
  CfdSourceLocation local_3a8;
  uint local_38c;
  undefined1 local_388 [4];
  uint32_t tmp_collect_buffer_size;
  uint local_324;
  ScriptElement *pSStack_320;
  uint32_t index_1;
  ScriptElement *pointer;
  uint local_310;
  uint32_t index;
  uint32_t check_count;
  uint32_t stack_offset;
  int64_t values [5];
  uint local_2d4;
  undefined1 local_2d0 [4];
  uint32_t convert_count;
  ScriptElement script_element_1;
  _Rb_tree_const_iterator<std::pair<const_cfd::core::ScriptType,_cfd::core::ScriptOperator>_>
  local_268;
  iterator local_260;
  _Rb_tree_const_iterator<std::pair<const_cfd::core::ScriptType,_cfd::core::ScriptOperator>_>
  local_258;
  const_iterator ite;
  ScriptType type;
  CfdSourceLocation local_228;
  uint local_210;
  undefined1 local_20a;
  allocator local_209;
  uint32_t uint_value;
  CfdSourceLocation local_1e8;
  ushort local_1cc;
  undefined1 local_1ca;
  allocator local_1c9;
  undefined1 local_1c8 [4];
  uint16_t ushort_value;
  CfdSourceLocation local_1a8;
  undefined1 local_190 [8];
  ScriptElement script_element;
  uint local_128;
  uint8_t view_data;
  uint32_t offset;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> top_collect_buffer;
  vector<unsigned_char,_std::allocator<unsigned_char>_> collect_buffer;
  uint32_t collect_buffer_size;
  bool is_collect_buffer;
  undefined4 uStack_e4;
  iterator local_e0;
  size_type local_d8;
  allocator<cfd::core::ScriptType> local_ca;
  less<cfd::core::ScriptType> local_c9;
  ScriptType local_c8 [14];
  iterator local_90;
  size_type local_88;
  allocator<cfd::core::ScriptType> local_6a;
  less<cfd::core::ScriptType> local_69;
  ScriptType local_68 [10];
  iterator local_40;
  size_type local_38;
  undefined1 local_30 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> buffer;
  ByteData *bytedata_local;
  Script *this_local;
  
  buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)bytedata;
  ByteData::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30,bytedata);
  if ((SetStackData(cfd::core::ByteData_const&)::kUseScriptNum1 == '\0') &&
     (iVar2 = __cxa_guard_acquire(&SetStackData(cfd::core::ByteData_const&)::kUseScriptNum1),
     iVar2 != 0)) {
    local_68[4] = kOpNegate;
    local_68[5] = kOpAbs;
    local_68[6] = kOpNot;
    local_68[7] = kOp0NotEqual;
    local_68[0] = kOpCheckSequenceVerify;
    local_68[1] = kOpCheckLockTimeVerify;
    local_68[2] = kOp1Add;
    local_68[3] = kOp1Sub;
    local_68[8] = kOpPick;
    local_68[9] = kOpRoll;
    local_40 = local_68;
    local_38 = 10;
    ::std::allocator<cfd::core::ScriptType>::allocator(&local_6a);
    __l_01._M_len = local_38;
    __l_01._M_array = local_40;
    ::std::
    set<cfd::core::ScriptType,_std::less<cfd::core::ScriptType>,_std::allocator<cfd::core::ScriptType>_>
    ::set(&SetStackData::kUseScriptNum1,__l_01,&local_69,&local_6a);
    ::std::allocator<cfd::core::ScriptType>::~allocator(&local_6a);
    __cxa_atexit(::std::
                 set<cfd::core::ScriptType,_std::less<cfd::core::ScriptType>,_std::allocator<cfd::core::ScriptType>_>
                 ::~set,&SetStackData::kUseScriptNum1,&__dso_handle);
    __cxa_guard_release(&SetStackData(cfd::core::ByteData_const&)::kUseScriptNum1);
  }
  if ((SetStackData(cfd::core::ByteData_const&)::kUseScriptNum2 == '\0') &&
     (iVar2 = __cxa_guard_acquire(&SetStackData(cfd::core::ByteData_const&)::kUseScriptNum2),
     iVar2 != 0)) {
    local_c8[8] = kOpBoolAnd;
    local_c8[9] = kOpLessThanOrEqual;
    local_c8[10] = kOpMin;
    local_c8[0xb] = kOpMax;
    local_c8[4] = kOpNumEqual;
    local_c8[5] = kOpNumEqualVerify;
    local_c8[6] = kOpNumNotEqual;
    local_c8[7] = kOpLessThan;
    local_c8[0] = kOpAdd;
    local_c8[1] = kOpSub;
    local_c8[2] = kOpGreaterThan;
    local_c8[3] = kOpBoolOr;
    local_c8[0xc] = 0xa2;
    local_90 = local_c8;
    local_88 = 0xd;
    ::std::allocator<cfd::core::ScriptType>::allocator(&local_ca);
    __l_00._M_len = local_88;
    __l_00._M_array = local_90;
    ::std::
    set<cfd::core::ScriptType,_std::less<cfd::core::ScriptType>,_std::allocator<cfd::core::ScriptType>_>
    ::set(&SetStackData::kUseScriptNum2,__l_00,&local_c9,&local_ca);
    ::std::allocator<cfd::core::ScriptType>::~allocator(&local_ca);
    __cxa_atexit(::std::
                 set<cfd::core::ScriptType,_std::less<cfd::core::ScriptType>,_std::allocator<cfd::core::ScriptType>_>
                 ::~set,&SetStackData::kUseScriptNum2,&__dso_handle);
    __cxa_guard_release(&SetStackData(cfd::core::ByteData_const&)::kUseScriptNum2);
  }
  if ((SetStackData(cfd::core::ByteData_const&)::kUseScriptNum3 == '\0') &&
     (iVar2 = __cxa_guard_acquire(&SetStackData(cfd::core::ByteData_const&)::kUseScriptNum3),
     iVar2 != 0)) {
    collect_buffer_size = 0xa5;
    uStack_e4 = 0xba;
    local_e0 = &collect_buffer_size;
    local_d8 = 2;
    this_00 = (allocator<cfd::core::ScriptType> *)
              ((long)&collect_buffer.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage + 6);
    ::std::allocator<cfd::core::ScriptType>::allocator(this_00);
    __l._M_len = local_d8;
    __l._M_array = local_e0;
    ::std::
    set<cfd::core::ScriptType,_std::less<cfd::core::ScriptType>,_std::allocator<cfd::core::ScriptType>_>
    ::set(&SetStackData::kUseScriptNum3,__l,
          (less<cfd::core::ScriptType> *)
          ((long)&collect_buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage + 7),this_00);
    ::std::allocator<cfd::core::ScriptType>::~allocator
              ((allocator<cfd::core::ScriptType> *)
               ((long)&collect_buffer.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage + 6));
    __cxa_atexit(::std::
                 set<cfd::core::ScriptType,_std::less<cfd::core::ScriptType>,_std::allocator<cfd::core::ScriptType>_>
                 ::~set,&SetStackData::kUseScriptNum3,&__dso_handle);
    __cxa_guard_release(&SetStackData(cfd::core::ByteData_const&)::kUseScriptNum3);
  }
  collect_buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._5_1_ = 0;
  collect_buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             &top_collect_buffer.
              super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  ::std::allocator<cfd::core::ByteData>::allocator((allocator<cfd::core::ByteData> *)&view_data);
  ::std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::vector
            ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)&offset,2,
             (allocator<cfd::core::ByteData> *)&view_data);
  ::std::allocator<cfd::core::ByteData>::~allocator((allocator<cfd::core::ByteData> *)&view_data);
  local_128 = 0;
  do {
    while( true ) {
      sVar4 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30);
      if (sVar4 <= local_128) {
        if ((collect_buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage._5_1_ & 1) != 0) {
          local_530.filename =
               strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/src/cfdcore_script.cpp"
                       ,0x2f);
          local_530.filename = local_530.filename + 1;
          local_530.line = 0x3e1;
          local_530.funcname = "SetStackData";
          logger::warn<>(&local_530,"incorrect script data.");
          pIVar12 = (InvalidScriptException *)__cxa_allocate_exception(0x30);
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string((string *)&local_550,"incorrect script data.",&local_551);
          InvalidScriptException::InvalidScriptException(pIVar12,&local_550);
          __cxa_throw(pIVar12,&InvalidScriptException::typeinfo,
                      InvalidScriptException::~InvalidScriptException);
        }
        ::std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector
                  ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)&offset);
        ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                   &top_collect_buffer.
                    super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage);
        ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30);
        return;
      }
      pbVar5 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30,
                          (ulong)local_128);
      script_element.value_._7_1_ = *pbVar5;
      if (script_element.value_._7_1_ == 0) {
        ScriptElement::ScriptElement
                  ((ScriptElement *)local_190,(ScriptOperator *)ScriptOperator::OP_0);
        ::std::vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>::
        push_back(&this->script_stack_,(value_type *)local_190);
        ScriptElement::~ScriptElement((ScriptElement *)local_190);
      }
      else if (script_element.value_._7_1_ < 0x4c) {
        collect_buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._0_4_ = (uint)script_element.value_._7_1_;
        collect_buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._5_1_ = 1;
        local_128 = local_128 + 1;
      }
      else if (script_element.value_._7_1_ == 0x4c) {
        sVar4 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30);
        if (sVar4 <= local_128 + 2) {
          local_1a8.filename =
               strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/src/cfdcore_script.cpp"
                       ,0x2f);
          local_1a8.filename = local_1a8.filename + 1;
          local_1a8.line = 0x35a;
          local_1a8.funcname = "SetStackData";
          logger::warn<>(&local_1a8,"OP_PUSHDATA1 is incorrect size.");
          local_1ca = 1;
          pIVar12 = (InvalidScriptException *)__cxa_allocate_exception(0x30);
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string
                    ((string *)local_1c8,"OP_PUSHDATA1 is incorrect size.",&local_1c9);
          InvalidScriptException::InvalidScriptException(pIVar12,(string *)local_1c8);
          local_1ca = 0;
          __cxa_throw(pIVar12,&InvalidScriptException::typeinfo,
                      InvalidScriptException::~InvalidScriptException);
        }
        pbVar5 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                           ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30,
                            (ulong)(local_128 + 1));
        collect_buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._0_4_ = (uint)*pbVar5;
        collect_buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._5_1_ = 1;
        local_128 = local_128 + 2;
      }
      else if (script_element.value_._7_1_ == 0x4d) {
        local_1cc = 0;
        sVar4 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30);
        if (sVar4 <= (ulong)(local_128 + 1) + 2) {
          local_1e8.filename =
               strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/src/cfdcore_script.cpp"
                       ,0x2f);
          local_1e8.filename = local_1e8.filename + 1;
          local_1e8.line = 0x365;
          local_1e8.funcname = "SetStackData";
          logger::warn<>(&local_1e8,"OP_PUSHDATA2 is incorrect size.");
          local_20a = 1;
          pIVar12 = (InvalidScriptException *)__cxa_allocate_exception(0x30);
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string
                    ((string *)&uint_value,"OP_PUSHDATA2 is incorrect size.",&local_209);
          InvalidScriptException::InvalidScriptException(pIVar12,(string *)&uint_value);
          local_20a = 0;
          __cxa_throw(pIVar12,&InvalidScriptException::typeinfo,
                      InvalidScriptException::~InvalidScriptException);
        }
        puVar6 = (ushort *)
                 ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                           ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30,
                            (ulong)(local_128 + 1));
        local_1cc = *puVar6;
        collect_buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._0_4_ = (uint)local_1cc;
        local_128 = local_128 + 3;
        collect_buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._5_1_ = 1;
      }
      else if (script_element.value_._7_1_ == 0x4e) {
        local_210 = 0;
        sVar4 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30);
        if (sVar4 <= (ulong)(local_128 + 1) + 4) {
          local_228.filename =
               strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/src/cfdcore_script.cpp"
                       ,0x2f);
          local_228.filename = local_228.filename + 1;
          local_228.line = 0x372;
          local_228.funcname = "SetStackData";
          logger::warn<>(&local_228,"OP_PUSHDATA4 is incorrect size.");
          ite._M_node._6_1_ = 1;
          pIVar12 = (InvalidScriptException *)__cxa_allocate_exception(0x30);
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string
                    ((string *)&type,"OP_PUSHDATA4 is incorrect size.",
                     (allocator *)((long)&ite._M_node + 7));
          InvalidScriptException::InvalidScriptException(pIVar12,(string *)&type);
          ite._M_node._6_1_ = 0;
          __cxa_throw(pIVar12,&InvalidScriptException::typeinfo,
                      InvalidScriptException::~InvalidScriptException);
        }
        puVar7 = (uint *)::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                                   ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                    local_30,(ulong)(local_128 + 1));
        local_210 = *puVar7;
        local_128 = local_128 + 5;
        collect_buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._5_1_ = 1;
        collect_buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._0_4_ = local_210;
      }
      else {
        ite._M_node._0_4_ = (uint)script_element.value_._7_1_;
        bVar1 = ::std::
                map<cfd::core::ScriptType,_cfd::core::ScriptOperator,_std::less<cfd::core::ScriptType>,_std::allocator<std::pair<const_cfd::core::ScriptType,_cfd::core::ScriptOperator>_>_>
                ::empty((map<cfd::core::ScriptType,_cfd::core::ScriptOperator,_std::less<cfd::core::ScriptType>,_std::allocator<std::pair<const_cfd::core::ScriptType,_cfd::core::ScriptOperator>_>_>
                         *)g_operator_map);
        if (!bVar1) {
          local_260._M_node =
               (_Base_ptr)
               ::std::
               map<cfd::core::ScriptType,_cfd::core::ScriptOperator,_std::less<cfd::core::ScriptType>,_std::allocator<std::pair<const_cfd::core::ScriptType,_cfd::core::ScriptOperator>_>_>
               ::find((map<cfd::core::ScriptType,_cfd::core::ScriptOperator,_std::less<cfd::core::ScriptType>,_std::allocator<std::pair<const_cfd::core::ScriptType,_cfd::core::ScriptOperator>_>_>
                       *)g_operator_map,(key_type *)&ite);
          ::std::
          _Rb_tree_const_iterator<std::pair<const_cfd::core::ScriptType,_cfd::core::ScriptOperator>_>
          ::_Rb_tree_const_iterator(&local_258,&local_260);
          script_element_1.value_ =
               (int64_t)::std::
                        map<cfd::core::ScriptType,_cfd::core::ScriptOperator,_std::less<cfd::core::ScriptType>,_std::allocator<std::pair<const_cfd::core::ScriptType,_cfd::core::ScriptOperator>_>_>
                        ::end((map<cfd::core::ScriptType,_cfd::core::ScriptOperator,_std::less<cfd::core::ScriptType>,_std::allocator<std::pair<const_cfd::core::ScriptType,_cfd::core::ScriptOperator>_>_>
                               *)g_operator_map);
          ::std::
          _Rb_tree_const_iterator<std::pair<const_cfd::core::ScriptType,_cfd::core::ScriptOperator>_>
          ::_Rb_tree_const_iterator(&local_268,(iterator *)&script_element_1.value_);
          bVar1 = ::std::operator!=(&local_258,&local_268);
          if (bVar1) {
            ppVar8 = ::std::
                     _Rb_tree_const_iterator<std::pair<const_cfd::core::ScriptType,_cfd::core::ScriptOperator>_>
                     ::operator->(&local_258);
            ScriptElement::ScriptElement((ScriptElement *)local_2d0,&ppVar8->second);
            ::std::vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>::
            push_back(&this->script_stack_,(value_type *)local_2d0);
            local_2d4 = 0;
            sVar9 = ::std::
                    set<cfd::core::ScriptType,_std::less<cfd::core::ScriptType>,_std::allocator<cfd::core::ScriptType>_>
                    ::count(&SetStackData::kUseScriptNum1,(key_type *)&ite);
            if (sVar9 == 0) {
              sVar9 = ::std::
                      set<cfd::core::ScriptType,_std::less<cfd::core::ScriptType>,_std::allocator<cfd::core::ScriptType>_>
                      ::count(&SetStackData::kUseScriptNum2,(key_type *)&ite);
              if (sVar9 == 0) {
                sVar9 = ::std::
                        set<cfd::core::ScriptType,_std::less<cfd::core::ScriptType>,_std::allocator<cfd::core::ScriptType>_>
                        ::count(&SetStackData::kUseScriptNum3,(key_type *)&ite);
                if ((sVar9 != 0) &&
                   (sVar4 = ::std::
                            vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                            ::size(&this->script_stack_), 3 < sVar4)) {
                  local_2d4 = 3;
                }
              }
              else {
                sVar4 = ::std::
                        vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                        ::size(&this->script_stack_);
                if (2 < sVar4) {
                  local_2d4 = 2;
                }
              }
            }
            else {
              sVar4 = ::std::
                      vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>::
                      size(&this->script_stack_);
              local_2d4 = (uint)(1 < sVar4);
            }
            if ((local_2d4 != 0) && (local_2d4 < 6)) {
              sVar4 = ::std::
                      vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>::
                      size(&this->script_stack_);
              index = (int)sVar4 - (local_2d4 + 1);
              local_310 = 0;
              for (pointer._4_4_ = 0; pointer._4_4_ < local_2d4; pointer._4_4_ = pointer._4_4_ + 1)
              {
                this_02 = ::std::
                          vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                          ::operator[](&this->script_stack_,(ulong)(index + pointer._4_4_));
                bVar1 = ScriptElement::ConvertBinaryToNumber
                                  (this_02,(int64_t *)(&check_count + (ulong)pointer._4_4_ * 2));
                if (bVar1) {
                  local_310 = local_310 + 1;
                }
              }
              if (local_310 == local_2d4) {
                pSStack_320 = ::std::
                              vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                              ::data(&this->script_stack_);
                for (local_324 = 0; local_324 < local_2d4; local_324 = local_324 + 1) {
                  ScriptElement::ScriptElement
                            ((ScriptElement *)local_388,
                             *(int64_t *)(&check_count + (ulong)local_324 * 2));
                  ScriptElement::operator=
                            (pSStack_320 + (index + local_324),(ScriptElement *)local_388);
                  ScriptElement::~ScriptElement((ScriptElement *)local_388);
                }
              }
            }
            ScriptElement::~ScriptElement((ScriptElement *)local_2d0);
          }
        }
      }
      if ((collect_buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage._5_1_ & 1) != 0) break;
      local_128 = local_128 + 1;
    }
    this_01 = &top_collect_buffer.
               super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>._M_impl
               .super__Vector_impl_data._M_end_of_storage;
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::clear
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this_01);
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this_01,
               (ulong)(uint)collect_buffer.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage);
    local_38c = (uint)collect_buffer.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage;
    uVar3 = local_128 +
            (uint)collect_buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage;
    sVar4 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30);
    if (sVar4 < uVar3) {
      sVar4 = ::std::vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>::
              size(&this->script_stack_);
      if (sVar4 < 2) {
LAB_0051de55:
        local_3c0.filename =
             strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/src/cfdcore_script.cpp"
                     ,0x2f);
        local_3c0.filename = local_3c0.filename + 1;
        local_3c0.line = 0x3c2;
        local_3c0.funcname = "SetStackData";
        logger::warn<>(&local_3c0,"buffer is incorrect size.");
        local_3e2 = 1;
        pIVar12 = (InvalidScriptException *)__cxa_allocate_exception(0x30);
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string((string *)&local_3e0,"buffer is incorrect size.",&local_3e1);
        InvalidScriptException::InvalidScriptException(pIVar12,&local_3e0);
        local_3e2 = 0;
        __cxa_throw(pIVar12,&InvalidScriptException::typeinfo,
                    InvalidScriptException::~InvalidScriptException);
      }
      pvVar10 = ::std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::operator[]
                          ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)
                           &offset,0);
      sVar11 = ByteData::GetDataSize(pvVar10);
      if (sVar11 != 3) goto LAB_0051de55;
      pvVar10 = ::std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::operator[]
                          ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)
                           &offset,1);
      sVar11 = ByteData::GetDataSize(pvVar10);
      if (sVar11 != 4) goto LAB_0051de55;
      sVar4 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30);
      local_38c = (int)sVar4 - local_128;
      local_3a8.filename =
           strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/src/cfdcore_script.cpp"
                   ,0x2f);
      local_3a8.filename = local_3a8.filename + 1;
      local_3a8.line = 0x3c0;
      local_3a8.funcname = "SetStackData";
      logger::warn<>(&local_3a8,"This script is coinbase scriptsig?");
    }
    local_3f8._M_current =
         (uchar *)::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30);
    local_3f0 = __gnu_cxx::
                __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                ::operator+(&local_3f8,(ulong)local_128);
    local_410._M_current =
         (uchar *)::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30);
    local_408 = __gnu_cxx::
                __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                ::operator+(&local_410,(ulong)local_128);
    local_400 = (uchar *)__gnu_cxx::
                         __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                         ::operator+(&local_408,(ulong)local_38c);
    ::std::vector<unsigned_char,std::allocator<unsigned_char>>::
    assign<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
              ((vector<unsigned_char,std::allocator<unsigned_char>> *)
               &top_collect_buffer.
                super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,local_3f0,
               (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                )local_400);
    sVar4 = ::std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::size
                      ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)&offset)
    ;
    sVar13 = ::std::vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>::
             size(&this->script_stack_);
    if (sVar13 < sVar4) {
      ByteData::ByteData((ByteData *)&script_element_2.value_,
                         (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                         &top_collect_buffer.
                          super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
      sVar4 = ::std::vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>::
              size(&this->script_stack_);
      pvVar10 = ::std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::operator[]
                          ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)
                           &offset,sVar4);
      ByteData::operator=(pvVar10,(ByteData *)&script_element_2.value_);
      ByteData::~ByteData((ByteData *)&script_element_2.value_);
    }
    if (local_38c < 5) {
      ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                 &byte_array.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,
                 (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                 &top_collect_buffer.
                  super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage);
      value = ConvertToNumber(this,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                   &byte_array.data_.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
      ScriptElement::ScriptElement((ScriptElement *)local_488,value,true);
      ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                 &byte_array.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      ::std::vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>::push_back
                (&this->script_stack_,(value_type *)local_488);
      ScriptElement::~ScriptElement((ScriptElement *)local_488);
    }
    else {
      ByteData::ByteData((ByteData *)&script_element_3.value_,
                         (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                         &top_collect_buffer.
                          super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
      ScriptElement::ScriptElement((ScriptElement *)local_518,(ByteData *)&script_element_3.value_);
      ::std::vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>::push_back
                (&this->script_stack_,(value_type *)local_518);
      ScriptElement::~ScriptElement((ScriptElement *)local_518);
      ByteData::~ByteData((ByteData *)&script_element_3.value_);
    }
    local_128 = local_38c + local_128;
    collect_buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._5_1_ = 0;
  } while( true );
}

Assistant:

void Script::SetStackData(const ByteData& bytedata) {
  std::vector<uint8_t> buffer = bytedata.GetBytes();
  static const std::set<ScriptType> kUseScriptNum1{
      kOpCheckSequenceVerify,
      kOpCheckLockTimeVerify,
      kOp1Add,
      kOp1Sub,
      kOpNegate,
      kOpAbs,
      kOpNot,
      kOp0NotEqual,
      kOpPick,
      kOpRoll};
  static const std::set<ScriptType> kUseScriptNum2{
      kOpAdd,
      kOpSub,
      kOpGreaterThan,
      kOpBoolOr,
      kOpNumEqual,
      kOpNumEqualVerify,
      kOpNumNotEqual,
      kOpLessThan,
      kOpBoolAnd,
      kOpLessThanOrEqual,
      kOpMin,
      kOpMax,
      kOpGreaterThanOrEqual};
  static const std::set<ScriptType> kUseScriptNum3{kOpWithIn, kOpCheckSigAdd};

  // create stack
  bool is_collect_buffer = false;
  uint32_t collect_buffer_size = 0;
  std::vector<uint8_t> collect_buffer;
  std::vector<ByteData> top_collect_buffer(2);
  uint32_t offset = 0;
  while (offset < buffer.size()) {
    uint8_t view_data = buffer[offset];
    if (kOp_0 == view_data) {
      // @formatter:off
      ScriptElement script_element = ScriptElement(ScriptOperator::OP_0);
      // @formatter:on
      script_stack_.push_back(script_element);

    } else if (view_data < kOpPushData1) {
      collect_buffer_size = view_data;
      is_collect_buffer = true;
      ++offset;

    } else if (view_data == kOpPushData1) {
      ++offset;
      if ((offset + 1) >= buffer.size()) {
        warn(CFD_LOG_SOURCE, "OP_PUSHDATA1 is incorrect size.");
        throw InvalidScriptException("OP_PUSHDATA1 is incorrect size.");
      }
      collect_buffer_size = buffer[offset];
      is_collect_buffer = true;
      ++offset;

    } else if (view_data == kOpPushData2) {
      ++offset;
      uint16_t ushort_value = 0;
      if ((offset + sizeof(uint16_t)) >= buffer.size()) {
        warn(CFD_LOG_SOURCE, "OP_PUSHDATA2 is incorrect size.");
        throw InvalidScriptException("OP_PUSHDATA2 is incorrect size.");
      }
      // process under LittleEndian
      memcpy(&ushort_value, &buffer[offset], sizeof(ushort_value));
      collect_buffer_size = ushort_value;
      offset += sizeof(ushort_value);
      is_collect_buffer = true;

    } else if (view_data == kOpPushData4) {
      ++offset;
      uint32_t uint_value = 0;
      if ((offset + sizeof(uint_value)) >= buffer.size()) {
        warn(CFD_LOG_SOURCE, "OP_PUSHDATA4 is incorrect size.");
        throw InvalidScriptException("OP_PUSHDATA4 is incorrect size.");
      }
      // process under LittleEndian
      memcpy(&uint_value, &buffer[offset], sizeof(uint_value));
      collect_buffer_size = uint_value;
      offset += sizeof(uint_value);
      is_collect_buffer = true;

    } else {
      // if ((bytedata == OP_0) || ((byteadata >= OP_PUSHDATA1)
      //     && (byteadata <= OP_NOP10)))
      // TODO(k-matsuzawa): Considering script extension, do not perform strict check of OP value.  // NOLINT

      // Setting for ScriptOperator
      ScriptType type = (ScriptType)view_data;
      if (!g_operator_map.empty()) {
        decltype(g_operator_map)::const_iterator ite =
            g_operator_map.find(type);
        if (ite != g_operator_map.end()) {
          ScriptElement script_element = ScriptElement(ite->second);
          script_stack_.push_back(script_element);

          // Since bytedata is stored as numerica type, after decoding bytedata
          // Re-convert to numeric type based on the contents of OP_CODE.
          /// Since OP_CHECKMULTISIG and OP_CHECKMULTISIGVERIFY are
          // in the range of OP_1-OP_16, they are excluded from
          // this conversion process.
          uint32_t convert_count = 0;
          if (kUseScriptNum1.count(type) > 0) {
            if (script_stack_.size() > 1) {
              convert_count = 1;
            }
          } else if (kUseScriptNum2.count(type) > 0) {
            if (script_stack_.size() > 2) {
              convert_count = 2;
            }
          } else if (kUseScriptNum3.count(type) > 0) {
            if (script_stack_.size() > 3) {
              convert_count = 3;
            }
          }

          static constexpr uint32_t kMaxArray = 5;
          if ((convert_count != 0) && (convert_count <= kMaxArray)) {
            int64_t values[kMaxArray];
            uint32_t stack_offset =
                static_cast<uint32_t>(script_stack_.size());
            stack_offset -= convert_count + 1;
            uint32_t check_count = 0;
            for (uint32_t index = 0; index < convert_count; ++index) {
              if (script_stack_[stack_offset + index].ConvertBinaryToNumber(
                      &values[index])) {
                ++check_count;
              }
            }
            if (check_count == convert_count) {
              ScriptElement* pointer = script_stack_.data();
              for (uint32_t index = 0; index < convert_count; ++index) {
                pointer[stack_offset + index] = ScriptElement(values[index]);
              }
            }
          }
        }
      }
    }

    if (is_collect_buffer) {
      collect_buffer.clear();
      collect_buffer.resize(collect_buffer_size);
      auto tmp_collect_buffer_size = collect_buffer_size;
      if ((offset + collect_buffer_size) > buffer.size()) {
        if ((script_stack_.size() >= 2) &&
            (top_collect_buffer[0].GetDataSize() == 3) &&
            (top_collect_buffer[1].GetDataSize() == 4)) {
          // (push past end) If script is coinbase scriptsig, length is low.
          tmp_collect_buffer_size =
              static_cast<uint32_t>(buffer.size()) - offset;
          warn(CFD_LOG_SOURCE, "This script is coinbase scriptsig?");
        } else {
          warn(CFD_LOG_SOURCE, "buffer is incorrect size.");
          throw InvalidScriptException("buffer is incorrect size.");
        }
      }

      // OK
      collect_buffer.assign(
          buffer.begin() + offset,
          buffer.begin() + offset + tmp_collect_buffer_size);

      if (top_collect_buffer.size() > script_stack_.size()) {
        // for coinbase script check
        top_collect_buffer[script_stack_.size()] = ByteData(collect_buffer);
      }
      if (tmp_collect_buffer_size <= kMaxScriptNumSize) {
        ScriptElement script_element =
            ScriptElement(ConvertToNumber(collect_buffer), true);
        script_stack_.push_back(script_element);
      } else {
        ByteData byte_array = ByteData(collect_buffer);
        ScriptElement script_element = ScriptElement(byte_array);
        script_stack_.push_back(script_element);
      }
      offset += tmp_collect_buffer_size;
      is_collect_buffer = false;
    } else {
      ++offset;
    }
  }
  if (is_collect_buffer) {
    // incorrect script
    warn(CFD_LOG_SOURCE, "incorrect script data.");
    throw InvalidScriptException("incorrect script data.");
  }
}